

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweeper_kba.h
# Opt level: O0

int Sweeper_nvilocal_(Sweeper *sweeper,Env *env)

{
  Bool_t BVar1;
  int iVar2;
  int local_1c;
  Env *env_local;
  Sweeper *sweeper_local;
  
  BVar1 = Env_cuda_is_using_device(env);
  if (BVar1 == 0) {
    iVar2 = Sweeper_nthread_m(sweeper,env);
    local_1c = iVar2 * 4 * sweeper->nthread_octant * sweeper->nthread_e * sweeper->nthread_x *
               sweeper->nthread_y * sweeper->nthread_z;
  }
  else {
    iVar2 = Sweeper_nthread_m(sweeper,env);
    local_1c = iVar2 * 4 * sweeper->nthread_octant * sweeper->nthread_x * sweeper->nthread_y *
               sweeper->nthread_z;
  }
  return local_1c;
}

Assistant:

static inline int Sweeper_nvilocal_( Sweeper* sweeper,
                                      Env*     env )
{
  return Env_cuda_is_using_device( env )
      ?
         Sweeper_nthread_m( sweeper, env ) *
         NU *
         sweeper->nthread_octant *
         sweeper->nthread_x *
         sweeper->nthread_y *
         sweeper->nthread_z
       :
         Sweeper_nthread_m( sweeper, env ) *
         NU *
         sweeper->nthread_octant *
         sweeper->nthread_e *
         sweeper->nthread_x *
         sweeper->nthread_y *
         sweeper->nthread_z
       ;
}